

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::storage_impl<$78c9f6e0$>::copy_table
          (storage_impl<_78c9f6e0_> *this,sqlite3 *db,string *name,
          vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
          *columnsToIgnore)

{
  anon_class_8_1_54a3980c aVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  system_error *psVar7;
  error_category *peVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  error_code __ec;
  error_code __ec_00;
  sqlite3_stmt *stmt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columnNames;
  __string_type query;
  stringstream ss;
  iterator<8UL,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,_std::tuple<long_relive::Stream::*>_>_>
  local_219;
  sqlite3 *local_218;
  anon_class_8_1_54a3980c local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  storage_impl<_78c9f6e0_> *local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  anon_class_16_2_825b6b41 local_1d8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [376];
  
  local_218 = db;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
  local_1d8.columnNames = &local_208;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210.l = &local_1d8;
  local_1f0 = this;
  local_1d8.columnsToIgnore = columnsToIgnore;
  tuple_helper::
  iterator<8UL,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>,_sqlite_orm::internal::column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)>,_sqlite_orm::internal::column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,_std::tuple<long_relive::Stream::*>_>_>
  ::
  operator()<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_gulrak[P]relive_client_thirdparty_sqlite_orm_sqlite_orm_h:6130:38)>
            (&local_219,&(this->table).columns,&local_210,false);
  pbVar3 = local_208.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = local_208.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"INSERT INTO ",0xc);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
  lVar12 = (long)pbVar3 - (long)pbVar2 >> 5;
  local_1e0 = pbVar2;
  local_1e8 = pbVar3;
  if (pbVar3 != pbVar2) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 *(char **)((long)local_208.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8),
                 *(long *)((long)&((local_208.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar10));
      if (uVar11 < lVar12 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,anon_var_dwarf_a6db1 + 0x3fe5,1);
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x20;
    } while (lVar12 + (ulong)(lVar12 == 0) != uVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") ",2);
  pbVar3 = local_1e0;
  pbVar2 = local_1e8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"SELECT ",7);
  if (pbVar2 != pbVar3) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 *(char **)((long)local_208.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8),
                 *(long *)((long)&((local_208.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar10));
      if (uVar11 < lVar12 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,anon_var_dwarf_a6db1 + 0x3fe5,1);
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x20;
    } while (lVar12 + (ulong)(lVar12 == 0) != uVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"FROM \'",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(local_1f0->table).super_table_base.name._M_dataplus._M_p
                      ,(local_1f0->table).super_table_base.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' ",2);
  std::__cxx11::stringbuf::str();
  iVar4 = sqlite3_prepare_v2(local_218,local_1d8.columnNames,0xffffffff,&local_210,0);
  aVar1.l = local_210.l;
  if (iVar4 == 0) {
    iVar4 = sqlite3_step(local_210.l);
    if (iVar4 == 0x65) {
      sqlite3_finalize(aVar1.l);
      if (local_1d8.columnNames !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1c8) {
        operator_delete(local_1d8.columnNames,
                        (ulong)((long)&((_Alloc_hider *)local_1c8._0_8_)->_M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_208);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return;
    }
    psVar7 = (system_error *)__cxa_allocate_exception(0x20);
    uVar5 = sqlite3_errcode(local_218);
    peVar8 = &get_sqlite_error_category()->super_error_category;
    pcVar9 = (char *)sqlite3_errmsg(local_218);
    __ec_00._4_4_ = 0;
    __ec_00._M_value = uVar5;
    __ec_00._M_cat = peVar8;
    std::system_error::system_error(psVar7,__ec_00,pcVar9);
    __cxa_throw(psVar7,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  psVar7 = (system_error *)__cxa_allocate_exception(0x20);
  uVar5 = sqlite3_errcode(local_218);
  peVar8 = &get_sqlite_error_category()->super_error_category;
  pcVar9 = (char *)sqlite3_errmsg(local_218);
  __ec._4_4_ = 0;
  __ec._M_value = uVar5;
  __ec._M_cat = peVar8;
  std::system_error::system_error(psVar7,__ec,pcVar9);
  __cxa_throw(psVar7,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void
    copy_table(sqlite3 *db, const std::string &name, const std::vector<table_info *> &columnsToIgnore) const {
        std::ignore = columnsToIgnore;

        std::stringstream ss;
        std::vector<std::string> columnNames;
        this->table.for_each_column([&columnNames, &columnsToIgnore](auto &c) {
          auto &columnName = c.name;
          auto columnToIgnoreIt = std::find_if(columnsToIgnore.begin(),
                                               columnsToIgnore.end(),
                                               [&columnName](auto tableInfoPointer) {
                                                 return columnName == tableInfoPointer->name;
                                               });
          if(columnToIgnoreIt == columnsToIgnore.end()) {
              columnNames.emplace_back(columnName);
          }
        });
        auto columnNamesCount = columnNames.size();
        ss << "INSERT INTO " << name << " (";
        for(size_t i = 0; i < columnNamesCount; ++i) {
            ss << columnNames[i];
            if(i < columnNamesCount - 1) {
                ss << ",";
            }
            ss << " ";
        }
        ss << ") ";
        ss << "SELECT ";
        for(size_t i = 0; i < columnNamesCount; ++i) {
            ss << columnNames[i];
            if(i < columnNamesCount - 1) {
                ss << ",";
            }
            ss << " ";
        }
        ss << "FROM '" << this->table.name << "' ";
        auto query = ss.str();
        sqlite3_stmt *stmt;
        if(sqlite3_prepare_v2(db, query.c_str(), -1, &stmt, nullptr) == SQLITE_OK) {
            statement_finalizer finalizer{stmt};
            if(sqlite3_step(stmt) == SQLITE_DONE) {
                //..
            } else {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        } else {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }